

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O2

bool __thiscall tcu::App::iterate(App *this)

{
  int iVar1;
  TestSessionExecutor *pTVar2;
  bool bVar3;
  int iVar4;
  RunMode RVar5;
  byte bVar6;
  char *format;
  double dVar7;
  
  if (this->m_testExecutor == (TestSessionExecutor *)0x0) {
    return false;
  }
  iVar4 = (*this->m_platform->_vptr_Platform[2])();
  if ((byte)iVar4 == 0) {
    format = "\nABORTED!\n";
  }
  else {
    bVar3 = TestSessionExecutor::iterate(this->m_testExecutor);
    bVar6 = 1;
    if (bVar3) goto LAB_0055118c;
    format = "\nDONE!\n";
  }
  bVar6 = 0;
  print(format);
  RVar5 = CommandLine::getRunMode(this->m_testCtx->m_cmdLine);
  if (RVar5 == RUNMODE_EXECUTE) {
    pTVar2 = this->m_testExecutor;
    print("\nTest run totals:\n");
    iVar1 = (pTVar2->m_status).numExecuted;
    dVar7 = 0.0;
    if (0 < iVar1) {
      dVar7 = (double)(((float)(pTVar2->m_status).numPassed * 100.0) / (float)iVar1);
    }
    print("  Passed:        %d/%d (%.1f%%)\n",dVar7);
    iVar1 = (pTVar2->m_status).numExecuted;
    dVar7 = 0.0;
    if (0 < iVar1) {
      dVar7 = (double)(((float)(pTVar2->m_status).numFailed * 100.0) / (float)iVar1);
    }
    print("  Failed:        %d/%d (%.1f%%)\n",dVar7);
    iVar1 = (pTVar2->m_status).numExecuted;
    dVar7 = 0.0;
    if (0 < iVar1) {
      dVar7 = (double)(((float)(pTVar2->m_status).numNotSupported * 100.0) / (float)iVar1);
    }
    print("  Not supported: %d/%d (%.1f%%)\n",dVar7);
    iVar1 = (pTVar2->m_status).numExecuted;
    dVar7 = 0.0;
    if (0 < iVar1) {
      dVar7 = (double)(((float)(pTVar2->m_status).numWarnings * 100.0) / (float)iVar1);
    }
    print("  Warnings:      %d/%d (%.1f%%)\n",dVar7);
    if ((pTVar2->m_status).isComplete == false) {
      bVar6 = 0;
      print("Test run was ABORTED!\n");
    }
    else {
      bVar6 = 0;
    }
  }
LAB_0055118c:
  return (bool)((byte)iVar4 & bVar6);
}

Assistant:

bool App::iterate (void)
{
	if (!m_testExecutor)
	{
		DE_ASSERT(m_testCtx->getCommandLine().getRunMode() != RUNMODE_EXECUTE);
		return false;
	}

	// Poll platform events
	const bool platformOk = m_platform.processEvents();

	// Iterate a step.
	bool testExecOk = false;
	if (platformOk)
	{
		try
		{
			testExecOk = m_testExecutor->iterate();
		}
		catch (const std::exception& e)
		{
			die("%s", e.what());
		}
	}

	if (!platformOk || !testExecOk)
	{
		if (!platformOk)
			print("\nABORTED!\n");
		else
			print("\nDONE!\n");

		const RunMode runMode = m_testCtx->getCommandLine().getRunMode();
		if (runMode == RUNMODE_EXECUTE)
		{
			const TestRunStatus& result = m_testExecutor->getStatus();

			// Report statistics.
			print("\nTest run totals:\n");
			print("  Passed:        %d/%d (%.1f%%)\n", result.numPassed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numPassed			/ (float)result.numExecuted) : 0.0f));
			print("  Failed:        %d/%d (%.1f%%)\n", result.numFailed,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numFailed			/ (float)result.numExecuted) : 0.0f));
			print("  Not supported: %d/%d (%.1f%%)\n", result.numNotSupported,	result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numNotSupported	/ (float)result.numExecuted) : 0.0f));
			print("  Warnings:      %d/%d (%.1f%%)\n", result.numWarnings,		result.numExecuted, (result.numExecuted > 0 ? (100.0f * (float)result.numWarnings		/ (float)result.numExecuted) : 0.0f));
			if (!result.isComplete)
				print("Test run was ABORTED!\n");
		}
	}

	return platformOk && testExecOk;
}